

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_haiku.c
# Opt level: O0

void init_tokens(void)

{
  float x;
  float y;
  float py;
  float px;
  int ty;
  int tx;
  int i;
  float token_y;
  float token_x;
  float token_w;
  int local_10;
  
  for (local_10 = 0; local_10 < 0x80; local_10 = local_10 + 1) {
    x = (float)(local_10 % 0x10) * 51.2 + 125.6;
    y = (float)(local_10 / 0x10) * 51.2 + 80.0;
    tokens[local_10].type = 4;
    tokens[local_10].x = x;
    tokens[local_10].y = y;
    tokens[local_10].pitch = 7 - local_10 / 0x10;
    init_sprite(&tokens[local_10].bot,4,x,y,0.8,0.4);
    init_sprite(&tokens[local_10].top,4,x,y,0.8,0.0);
  }
  return;
}

Assistant:

static void init_tokens(void)
{
   const float token_w = token_size * token_scale;
   const float token_x = game_board_x + token_w/2.0;
   const float token_y = 80;
   int i;

   for (i = 0; i < NUM_TOKENS; i++) {
      int tx = i % TOKENS_X;
      int ty = i / TOKENS_X;
      float px = token_x + tx * token_w;
      float py = token_y + ty * token_w;

      tokens[i].type = TYPE_NONE;
      tokens[i].x = px;
      tokens[i].y = py;
      tokens[i].pitch = NUM_PITCH - 1 - ty;
      assert(tokens[i].pitch >= 0 && tokens[i].pitch < NUM_PITCH);
      init_sprite(&tokens[i].bot, IMG_BLACK, px, py, token_scale, 0.4);
      init_sprite(&tokens[i].top, IMG_BLACK, px, py, token_scale, 0.0);
   }
}